

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aom_codec.c
# Opt level: O0

char * aom_codec_err_to_string(aom_codec_err_t err)

{
  aom_codec_err_t err_local;
  char *local_8;
  
  switch(err) {
  case AOM_CODEC_OK:
    local_8 = "Success";
    break;
  case AOM_CODEC_ERROR:
    local_8 = "Unspecified internal error";
    break;
  case AOM_CODEC_MEM_ERROR:
    local_8 = "Memory allocation error";
    break;
  case AOM_CODEC_ABI_MISMATCH:
    local_8 = "ABI version mismatch";
    break;
  case AOM_CODEC_INCAPABLE:
    local_8 = "Codec does not implement requested capability";
    break;
  case AOM_CODEC_UNSUP_BITSTREAM:
    local_8 = "Bitstream not supported by this decoder";
    break;
  case AOM_CODEC_UNSUP_FEATURE:
    local_8 = "Bitstream required feature not supported by this decoder";
    break;
  case AOM_CODEC_CORRUPT_FRAME:
    local_8 = "Corrupt frame detected";
    break;
  case AOM_CODEC_INVALID_PARAM:
    local_8 = "Invalid parameter";
    break;
  case AOM_CODEC_LIST_END:
    local_8 = "End of iterated list";
    break;
  default:
    local_8 = "Unrecognized error code";
  }
  return local_8;
}

Assistant:

const char *aom_codec_err_to_string(aom_codec_err_t err) {
  switch (err) {
    case AOM_CODEC_OK: return "Success";
    case AOM_CODEC_ERROR: return "Unspecified internal error";
    case AOM_CODEC_MEM_ERROR: return "Memory allocation error";
    case AOM_CODEC_ABI_MISMATCH: return "ABI version mismatch";
    case AOM_CODEC_INCAPABLE:
      return "Codec does not implement requested capability";
    case AOM_CODEC_UNSUP_BITSTREAM:
      return "Bitstream not supported by this decoder";
    case AOM_CODEC_UNSUP_FEATURE:
      return "Bitstream required feature not supported by this decoder";
    case AOM_CODEC_CORRUPT_FRAME: return "Corrupt frame detected";
    case AOM_CODEC_INVALID_PARAM: return "Invalid parameter";
    case AOM_CODEC_LIST_END: return "End of iterated list";
  }

  return "Unrecognized error code";
}